

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Thread::~Thread(Thread *this)

{
  Thread *local_10;
  
  local_10 = this;
  std::
  _Rb_tree<wabt::interp::Thread_*,_wabt::interp::Thread_*,_std::_Identity<wabt::interp::Thread_*>,_std::less<wabt::interp::Thread_*>,_std::allocator<wabt::interp::Thread_*>_>
  ::erase(&(this->store_->threads_)._M_t,&local_10);
  std::
  unique_ptr<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
  ::~unique_ptr(&this->trace_source_);
  std::_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~_Vector_base
            (&(this->exceptions_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
            (&(this->values_).
              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>);
  std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~_Vector_base
            ((_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)this);
  return;
}

Assistant:

Thread::~Thread() {
  store_.threads().erase(this);
}